

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8Toascii(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  byte *pbVar2;
  uchar *processed;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  uchar *puVar9;
  byte *pbVar10;
  
  iVar6 = (int)out;
  iVar4 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      pbVar7 = in;
      if (0 < (long)*inlen) {
        pbVar8 = in + *inlen;
        puVar9 = out + *outlen;
        do {
          bVar1 = *pbVar7;
          uVar3 = (uint)bVar1;
          lVar5 = 0;
          if ((char)bVar1 < '\0') {
            if (bVar1 < 0xc0) goto LAB_001440fa;
            if (bVar1 < 0xe0) {
              uVar3 = bVar1 & 0x1f;
              lVar5 = 1;
            }
            else if (bVar1 < 0xf0) {
              uVar3 = bVar1 & 0xf;
              lVar5 = 2;
            }
            else {
              if (0xf7 < bVar1) goto LAB_001440fa;
              uVar3 = bVar1 & 7;
              lVar5 = 3;
            }
          }
          pbVar10 = pbVar7 + 1;
          iVar4 = (int)lVar5;
          if ((long)pbVar8 - (long)pbVar10 < lVar5) break;
          if (pbVar10 < pbVar8 && (char)bVar1 < '\0') {
            pbVar2 = pbVar7 + 2;
            do {
              pbVar10 = pbVar2;
              iVar4 = iVar4 + -1;
              if (((pbVar10[-1] & 0xffffffc0) != 0x80) ||
                 (uVar3 = pbVar10[-1] & 0x3f | uVar3 << 6, iVar4 == 0)) break;
              pbVar2 = pbVar10 + 1;
            } while (pbVar10 < pbVar8);
          }
          if (0x7f < uVar3) {
LAB_001440fa:
            *outlen = (int)out - iVar6;
            *inlen = (int)pbVar7 - (int)in;
            return -2;
          }
          if (puVar9 <= out) break;
          *out = (uchar)uVar3;
          out = out + 1;
          pbVar7 = pbVar10;
        } while (pbVar10 < pbVar8);
      }
      *outlen = (int)out - iVar6;
      *inlen = (int)pbVar7 - (int)in;
      return *outlen;
    }
    iVar4 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar4;
}

Assistant:

static int
UTF8Toascii(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + (*inlen);
    outend = out + (*outlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing) {
	    break;
	}

	for ( ; trailing; trailing--) {
	    if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
		break;
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if (c < 0x80) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(*outlen);
}